

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall List<String>::merge(List<String> *this,List<String> *other)

{
  int iVar1;
  int iVar2;
  _Deque_iterator<String,_String_&,_String_*> local_c0;
  Iterator local_a0;
  _Self local_80;
  ConstIterator local_60;
  ConstIterator local_40;
  int local_1c;
  List<String> *pLStack_18;
  int oldsize;
  List<String> *other_local;
  List<String> *this_local;
  
  pLStack_18 = other;
  other_local = this;
  local_1c = size(this);
  iVar1 = size(this);
  iVar2 = size(pLStack_18);
  resize(this,iVar1 + iVar2);
  begin(&local_40,pLStack_18);
  end(&local_60,pLStack_18);
  begin(&local_a0,this);
  std::operator+(&local_80,&local_a0,(long)local_1c);
  std::
  copy<std::_Deque_iterator<String,String_const&,String_const*>,std::_Deque_iterator<String,String&,String*>>
            (&local_c0,&local_40,&local_60,&local_80);
  return;
}

Assistant:

void List<T>::merge (const List<T>& other)
{
	int oldsize = size();
	resize (size() + other.size());
	std::copy (other.begin(), other.end(), begin() + oldsize);
}